

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::PushColormap(ImPlotColormap colormap)

{
  bool bVar1;
  ImPlotContext *pIVar2;
  ImPlotContext *gp;
  ImPlotColormap colormap_local;
  
  pIVar2 = GImPlot;
  bVar1 = false;
  if ((-1 < colormap) && (bVar1 = false, colormap < (GImPlot->ColormapData).Count)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(colormap >= 0 && colormap < gp.ColormapData.Count) && \"The colormap index is invalid!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xd18,"void ImPlot::PushColormap(ImPlotColormap)");
  }
  ImVector<int>::push_back(&GImPlot->ColormapModifiers,&(GImPlot->Style).Colormap);
  (pIVar2->Style).Colormap = colormap;
  return;
}

Assistant:

void PushColormap(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(colormap >= 0 && colormap < gp.ColormapData.Count, "The colormap index is invalid!");
    gp.ColormapModifiers.push_back(gp.Style.Colormap);
    gp.Style.Colormap = colormap;
}